

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_square_matrix.h
# Opt level: O0

void __thiscall
sparse_square_matrix<bool>::set(sparse_square_matrix<bool> *this,uint32_t i,uint32_t j,bool *value)

{
  bool bVar1;
  mapped_type *pmVar2;
  ulong local_38;
  reference local_30;
  bool *local_20;
  bool *value_local;
  uint32_t j_local;
  uint32_t i_local;
  sparse_square_matrix<bool> *this_local;
  
  local_20 = value;
  value_local._0_4_ = j;
  value_local._4_4_ = i;
  _j_local = this;
  if (this->N <= i) {
    __assert_fail("i < N",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/sparse_square_matrix.h"
                  ,0x2f,
                  "void sparse_square_matrix<bool>::set(uint32_t, uint32_t, const Ty &) [Ty = bool]"
                 );
  }
  if (j < this->N) {
    bVar1 = usingDenseStorage(this);
    if (bVar1) {
      bVar1 = *local_20;
      local_30 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (&this->denseStorage,
                            (ulong)(value_local._4_4_ * this->N + (uint32_t)value_local));
      std::_Bit_reference::operator=(&local_30,(bool)(bVar1 & 1));
    }
    else {
      bVar1 = *local_20;
      local_38 = (ulong)(value_local._4_4_ * this->N + (uint32_t)value_local);
      pmVar2 = std::
               unordered_map<unsigned_long,_bool,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_bool>_>_>
               ::operator[](&this->sparseStorage,&local_38);
      *pmVar2 = (mapped_type)(bVar1 & 1);
    }
    return;
  }
  __assert_fail("j < N",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/sparse_square_matrix.h"
                ,0x30,
                "void sparse_square_matrix<bool>::set(uint32_t, uint32_t, const Ty &) [Ty = bool]");
}

Assistant:

void set(uint32_t i, uint32_t j, const Ty& value) {
    assert(i < N);
    assert(j < N);
    if (usingDenseStorage()) {
      denseStorage[i * N + j] = value;
    } else {
      sparseStorage[i * N + j] = value;
    }
  }